

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iibmalloc.cpp
# Opt level: O1

void operator_delete__(void *ptr,size_t sz,align_val_t al)

{
  long lVar1;
  ulong uVar2;
  char *in_RCX;
  char *in_R8;
  unsigned_long *in_R9;
  long in_FS_OFFSET;
  align_val_t local_20;
  undefined1 *local_18;
  anon_class_8_1_3fcf64e9 local_10;
  
  local_18 = &stack0xffffffffffffffd8;
  local_20 = al;
  if (*(long *)(in_FS_OFFSET + -0x20) == 0) {
    local_10.al = (align_val_t *)0x20;
    nodecpp::assert::
    nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)2,operator_delete_impl(void*,std::align_val_t)::_lambda()_2_,unsigned_long,unsigned_long>
              ((char *)&local_18,(int)&local_20,&local_10,in_RCX,in_R8,in_R9,(unsigned_long *)al);
    free(ptr);
  }
  else {
    local_18 = &stack0xffffffffffffffd8;
    nodecpp::assert::
    nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)2,operator_delete_impl(void*,std::align_val_t)::_lambda()_1_,unsigned_long,unsigned_long>
              ((char *)&local_18,(int)&local_20,(anon_class_8_1_3fcf64e9 *)al,in_RCX,in_R8,in_R9,
               (unsigned_long *)al);
    if (ptr != (void *)0x0) {
      lVar1 = *(long *)(in_FS_OFFSET + -0x20);
      if (((uint)ptr & 0xfff) == 0x20) {
        nodecpp::iibmalloc::
        BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_8388608UL,_(unsigned_short)32>::
        deallocate((BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_8388608UL,_(unsigned_short)32>
                    *)(lVar1 + 0x200),(void *)((ulong)ptr & 0xfffffffffffff000));
      }
      else {
        uVar2 = (ulong)((uint)((ulong)ptr >> 0xe) & 0x1f8);
        *(undefined8 *)ptr = *(undefined8 *)(lVar1 + uVar2);
        *(void **)(lVar1 + uVar2) = ptr;
      }
    }
  }
  return;
}

Assistant:

void operator delete[]( void* ptr, std::size_t sz, std::align_val_t al ) noexcept
{
	operator_delete_impl(ptr, al);
}